

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  uint16_t b;
  uint16_t a;
  uint16_t b_max_1;
  uint16_t a_max_1;
  __m128i p_1;
  __m128i sm16_1;
  int iStack_1a8;
  int r_1;
  __m128i res_v_1;
  uint16_t b_max;
  undefined8 uStack_188;
  uint16_t a_max;
  __m128i p;
  __m128i sm16;
  int iStack_158;
  int r;
  __m128i res_v;
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  ulong uStack_108;
  int vectorlength;
  size_t i_b;
  size_t i_a;
  size_t count;
  uint16_t *C_local;
  size_t s_b_local;
  uint16_t *B_local;
  size_t s_a_local;
  uint16_t *A_local;
  
  i_a = 0;
  i_b = 0;
  uStack_108 = 0;
  uVar3 = s_a & 0xfffffffffffffff8;
  uVar4 = s_b & 0xfffffffffffffff8;
  if ((uVar3 != 0) && (uVar4 != 0)) {
    unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])A);
    unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])B);
LAB_00101619:
    bVar6 = true;
    if (A[i_b] != 0) {
      bVar6 = B[uStack_108] == 0;
    }
    if (!bVar6) goto LAB_0010185a;
    vpcmpestrm_avx(stack0xfffffffffffffeb8,stack0xfffffffffffffec8,1);
    iStack_158 = (int)res_v[1];
    auVar2 = vpshufb_avx(stack0xfffffffffffffec8,
                         *(undefined1 (*) [16])(shuffle_mask16 + (long)iStack_158 * 0x10));
    uStack_188 = auVar2._0_8_;
    p[0] = auVar2._8_8_;
    *(undefined8 *)(C + i_a) = uStack_188;
    *(longlong *)(C + i_a + 4) = p[0];
    i_a = (long)POPCOUNT(iStack_158) + i_a;
    lVar5 = i_b + 7;
    if (A[lVar5] <= B[uStack_108 + 7]) {
      i_b = i_b + 8;
      if (i_b == uVar3) goto LAB_0010185a;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(A + i_b));
    }
    if (B[uStack_108 + 7] <= A[lVar5]) {
      uStack_108 = uStack_108 + 8;
      if (uStack_108 == uVar4) goto LAB_0010185a;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(B + uStack_108));
    }
    goto LAB_00101619;
  }
  goto LAB_00101a78;
LAB_0010185a:
  if ((i_b < uVar3) && (uStack_108 < uVar4)) {
LAB_00101884:
    vpcmpistrm_avx(stack0xfffffffffffffeb8,stack0xfffffffffffffec8,1);
    iStack_1a8 = (int)res_v[1];
    auVar2 = vpshufb_avx(stack0xfffffffffffffec8,
                         *(undefined1 (*) [16])(shuffle_mask16 + (long)iStack_1a8 * 0x10));
    _b = auVar2._0_8_;
    p_1[0] = auVar2._8_8_;
    *(undefined8 *)(C + i_a) = _b;
    *(longlong *)(C + i_a + 4) = p_1[0];
    i_a = (long)POPCOUNT(iStack_1a8) + i_a;
    lVar5 = i_b + 7;
    if (A[lVar5] <= B[uStack_108 + 7]) {
      i_b = i_b + 8;
      if (i_b == uVar3) goto LAB_00101a78;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(A + i_b));
    }
    if (B[uStack_108 + 7] <= A[lVar5]) {
      uStack_108 = uStack_108 + 8;
      if (uStack_108 == uVar4) goto LAB_00101a78;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(B + uStack_108));
    }
    goto LAB_00101884;
  }
LAB_00101a78:
  while (i_b < s_a && uStack_108 < s_b) {
    uVar1 = A[i_b];
    if (uVar1 < B[uStack_108]) {
      i_b = i_b + 1;
    }
    else {
      if (uVar1 <= B[uStack_108]) {
        C[i_a] = uVar1;
        i_a = i_a + 1;
        i_b = i_b + 1;
      }
      uStack_108 = uStack_108 + 1;
    }
  }
  return (int32_t)i_a;
}

Assistant:

CROARING_TARGET_AVX2
int32_t intersect_vector16(const uint16_t *__restrict__ A, size_t s_a,
                           const uint16_t *__restrict__ B, size_t s_b,
                           uint16_t *C) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            __m128i sm16 = _mm_load_si128((const __m128i *)shuffle_mask16 + r);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                __m128i sm16 =
                    _mm_load_si128((const __m128i *)shuffle_mask16 + r);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            C[count] = a;  //==b;
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}